

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O2

void send_failure_info(char *msg)

{
  FILE *fdes;
  FailMsg fmsg;
  
  fmsg.msg = strdup(msg);
  fdes = get_pipe();
  ppack(fdes,CK_MSG_FAIL,(CheckMsg *)&fmsg);
  free(fmsg.msg);
  return;
}

Assistant:

void send_failure_info(const char *msg)
{
    FailMsg fmsg;

    fmsg.msg = strdup(msg);
    ppack(get_pipe(), CK_MSG_FAIL, (CheckMsg *) & fmsg);
    free(fmsg.msg);
}